

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O2

void interp1Q(double x,double shift,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  int iVar1;
  ulong uVar2;
  int i;
  void *pvVar3;
  double *y_00;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar8 = 0;
  uVar5 = 0;
  if (0 < xi_length) {
    uVar5 = (ulong)(uint)xi_length;
  }
  uVar2 = 0xffffffffffffffff;
  uVar6 = (long)xi_length * 4;
  if (xi_length < 0) {
    uVar6 = uVar2;
  }
  uVar7 = (long)xi_length << 3;
  if (xi_length < 0) {
    uVar7 = uVar2;
  }
  pvVar3 = operator_new__(uVar7);
  uVar7 = (long)x_length * 8;
  if (x_length < 0) {
    uVar7 = uVar2;
  }
  y_00 = (double *)operator_new__(uVar7);
  pvVar4 = operator_new__(uVar6);
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    dVar9 = (xi[uVar8] - x) / shift;
    *(int *)((long)pvVar4 + uVar8 * 4) = (int)dVar9;
    *(double *)((long)pvVar3 + uVar8 * 8) = dVar9 - (double)(int)dVar9;
  }
  diff(y,x_length,y_00);
  y_00[(long)x_length + -1] = 0.0;
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    iVar1 = *(int *)((long)pvVar4 + uVar8 * 4);
    yi[uVar8] = y_00[iVar1] * *(double *)((long)pvVar3 + uVar8 * 8) + y[iVar1];
  }
  operator_delete__(pvVar3);
  operator_delete__(pvVar4);
  operator_delete__(y_00);
  return;
}

Assistant:

void interp1Q(double x, double shift, const double *y, int x_length,
    const double *xi, int xi_length, double *yi) {
  double *xi_fraction = new double[xi_length];
  double *delta_y = new double[x_length];
  int *xi_base = new int[xi_length];

  double delta_x = shift;
  for (int i = 0; i < xi_length; ++i) {
    xi_base[i] = static_cast<int>((xi[i] - x) / delta_x);
    xi_fraction[i] = (xi[i] - x) / delta_x - xi_base[i];
  }
  diff(y, x_length, delta_y);
  delta_y[x_length - 1] = 0.0;

  for (int i = 0; i < xi_length; ++i)
    yi[i] = y[xi_base[i]] + delta_y[xi_base[i]] * xi_fraction[i];

  // Bug was fixed at 2013/07/14 by M. Morise
  delete[] xi_fraction;
  delete[] xi_base;
  delete[] delta_y;
}